

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name-component.c
# Opt level: O0

void name_component_print(name_component_t *component)

{
  ndn_time_us_t nVar1;
  uint64_t uVar2;
  int local_1c;
  int local_18;
  int j_2;
  int j_1;
  int j;
  name_component_t *component_local;
  
  switch(component->type) {
  case 1:
    printf("/sha256digiest=0x");
    for (j_2 = 0; j_2 < (int)(uint)component->size; j_2 = j_2 + 1) {
      printf("%02x",(ulong)component->value[j_2]);
    }
    break;
  case 2:
    printf("/params-sha256=0x");
    for (local_18 = 0; local_18 < (int)(uint)component->size; local_18 = local_18 + 1) {
      printf("%02x",(ulong)component->value[local_18]);
    }
    break;
  default:
    printf("/");
    for (local_1c = 0; local_1c < (int)(uint)component->size; local_1c = local_1c + 1) {
      if ((component->value[local_1c] < 0x21) || (0x7d < component->value[local_1c])) {
        printf("0x%02x",(ulong)component->value[local_1c]);
      }
      else {
        printf("%c",(ulong)component->value[local_1c]);
      }
    }
    break;
  case 0x23:
    uVar2 = name_component_to_version(component);
    printf("/v=%lu",uVar2);
    break;
  case 0x24:
    nVar1 = name_component_to_timestamp(component);
    printf("/t=%lu",nVar1);
    break;
  case 0x25:
    uVar2 = name_component_to_sequence_num(component);
    printf("/seq=%lu",uVar2);
  }
  return;
}

Assistant:

void
name_component_print(const name_component_t* component)
{
  switch (component->type) {
    case TLV_ImplicitSha256DigestComponent:
      printf("/sha256digiest=0x");
      for (int j = 0; j < component->size; j++) {
        printf("%02x", component->value[j]);
      }
      break;

    case TLV_ParametersSha256DigestComponent:
      printf("/params-sha256=0x");
      for (int j = 0; j < component->size; j++) {
        printf("%02x", component->value[j]);
      }
      break;

    case TLV_VersionNameComponent:
      printf("/v=%" PRIu64 "", name_component_to_version(component));
      break;

    case TLV_TimestampNameComponent:
      printf("/t=%" PRI_ndn_time_us_t "", name_component_to_timestamp(component));
      break;

    case TLV_SequenceNumNameComponent:
      printf("/seq=%" PRIu64 "", name_component_to_sequence_num(component));
      break;

    default:
      printf("/");
      for (int j = 0; j < component->size; j++) {
        if (component->value[j] >= 33 && component->value[j] < 126) {
          printf("%c", component->value[j]);
        }
        else {
          printf("0x%02x", component->value[j]);
        }
      }
      break;
  }
}